

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::DeepTiledOutputFile::DeepTiledOutputFile
          (DeepTiledOutputFile *this,OStream *os,Header *header,int numThreads)

{
  OStream *os_00;
  _func_int *p_Var1;
  undefined8 uVar2;
  undefined8 in_RSI;
  GenericOutputFile *in_RDI;
  bool in_stack_00000017;
  OStream *in_stack_00000018;
  Header *in_stack_00000020;
  stringstream _iex_replace_s;
  BaseExc *e;
  undefined1 in_stack_0000189e;
  undefined1 in_stack_0000189f;
  Header *in_stack_000018a0;
  OutputStreamMutex *in_stack_fffffffffffffdd0;
  OStream *in_stack_fffffffffffffdd8;
  GenericOutputFile *in_stack_fffffffffffffde0;
  TileOffsets *in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe4c;
  Data *in_stack_fffffffffffffe50;
  Header *in_stack_fffffffffffffe78;
  DeepTiledOutputFile *in_stack_fffffffffffffe80;
  
  GenericOutputFile::GenericOutputFile(in_RDI);
  in_RDI->_vptr_GenericOutputFile = (_func_int **)&PTR__DeepTiledOutputFile_00562af0;
  os_00 = (OStream *)operator_new(0x1d0);
  Data::Data(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
  in_RDI[1]._vptr_GenericOutputFile = (_func_int **)os_00;
  p_Var1 = (_func_int *)operator_new(0x38);
  OutputStreamMutex::OutputStreamMutex(in_stack_fffffffffffffdd0);
  in_RDI[1]._vptr_GenericOutputFile[0x38] = p_Var1;
  *(undefined1 *)(in_RDI[1]._vptr_GenericOutputFile + 0x39) = 0;
  Header::sanityCheck(in_stack_000018a0,(bool)in_stack_0000189f,(bool)in_stack_0000189e);
  *(undefined8 *)(in_RDI[1]._vptr_GenericOutputFile[0x38] + 0x28) = in_RSI;
  initialize(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  uVar2 = (**(code **)(**(long **)(in_RDI[1]._vptr_GenericOutputFile[0x38] + 0x28) + 0x18))();
  *(undefined8 *)(in_RDI[1]._vptr_GenericOutputFile[0x38] + 0x30) = uVar2;
  GenericOutputFile::writeMagicNumberAndVersionField
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,(Header *)in_stack_fffffffffffffdd0
            );
  p_Var1 = (_func_int *)Header::writeTo(in_stack_00000020,in_stack_00000018,in_stack_00000017);
  in_RDI[1]._vptr_GenericOutputFile[0x17] = p_Var1;
  p_Var1 = (_func_int *)TileOffsets::writeTo(in_stack_fffffffffffffe40,os_00);
  in_RDI[1]._vptr_GenericOutputFile[0x2a] = p_Var1;
  *(undefined1 *)((long)in_RDI[1]._vptr_GenericOutputFile + 0x3c) = 0;
  return;
}

Assistant:

DeepTiledOutputFile::DeepTiledOutputFile
    (OPENEXR_IMF_INTERNAL_NAMESPACE::OStream &os,
     const Header &header,
     int numThreads)
:
    _data (new Data (numThreads))
{
    _data->_streamData=new OutputStreamMutex();
    _data->_deleteStream=false;
    
    try
    {
        header.sanityCheck(true);
        _data->_streamData->os = &os;
        initialize (header);
        _data->_streamData->currentPosition = _data->_streamData->os->tellp();

        // Write header and empty offset table to the file.
        writeMagicNumberAndVersionField(*_data->_streamData->os, _data->header);
        _data->previewPosition = _data->header.writeTo (*_data->_streamData->os, true);
        _data->tileOffsetsPosition = _data->tileOffsets.writeTo (*_data->_streamData->os);
	_data->multipart = false;
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        if (_data && _data->_streamData) delete _data->_streamData;
        if (_data)       delete _data;

        REPLACE_EXC (e, "Cannot open image file "
                     "\"" << os.fileName() << "\". " << e.what());
        throw;
    }
    catch (...)
    {
        if (_data && _data->_streamData) delete _data->_streamData;
        if (_data)       delete _data;

        throw;
    }
}